

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
          (EncodedDescriptorDatabase *this,string *symbol_name,string *output)

{
  byte bVar1;
  bool bVar2;
  uint32 uVar3;
  byte *data;
  int size;
  uint32 first_byte_or_zero;
  pair<const_void_*,_int> pVar4;
  CodedInputStream input;
  FileDescriptorProto file_proto;
  CodedInputStream local_148;
  FileDescriptorProto local_f8;
  
  pVar4 = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::FindSymbol
                    (&this->index_,symbol_name);
  data = (byte *)pVar4.first;
  first_byte_or_zero = 0;
  if (data == (byte *)0x0) {
    return false;
  }
  size = pVar4.second;
  local_148.buffer_end_ = data + size;
  local_148.input_ = (ZeroCopyInputStream *)0x0;
  local_148.overflow_bytes_ = 0;
  local_148.last_tag_ = 0;
  local_148.legitimate_message_end_ = false;
  local_148.aliasing_enabled_ = false;
  local_148.buffer_size_after_limit_ = 0;
  local_148.total_bytes_limit_ = 0x7fffffff;
  local_148.recursion_budget_ = io::CodedInputStream::default_recursion_limit_;
  local_148.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_148.disable_strict_correctness_enforcement_ = true;
  local_148.extension_pool_ = (DescriptorPool *)0x0;
  local_148.extension_factory_ = (MessageFactory *)0x0;
  local_148.total_bytes_read_ = size;
  local_148.current_limit_ = size;
  if (0 < size) {
    bVar1 = *data;
    first_byte_or_zero = (uint32)bVar1;
    uVar3 = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      local_148.buffer_ = data + 1;
      goto LAB_0030b0f3;
    }
  }
  local_148.buffer_ = data;
  uVar3 = io::CodedInputStream::ReadTagFallback(&local_148,first_byte_or_zero);
LAB_0030b0f3:
  if (uVar3 == 10) {
    bVar2 = internal::WireFormatLite::ReadBytes(&local_148,output);
  }
  else {
    FileDescriptorProto::FileDescriptorProto(&local_f8);
    bVar2 = MessageLite::ParseFromArray((MessageLite *)&local_f8,data,size);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)output);
    }
    FileDescriptorProto::~FileDescriptorProto(&local_f8);
  }
  io::CodedInputStream::~CodedInputStream(&local_148);
  return bVar2;
}

Assistant:

bool EncodedDescriptorDatabase::FindNameOfFileContainingSymbol(
    const string& symbol_name,
    string* output) {
  std::pair<const void*, int> encoded_file = index_.FindSymbol(symbol_name);
  if (encoded_file.first == NULL) return false;

  // Optimization:  The name should be the first field in the encoded message.
  //   Try to just read it directly.
  io::CodedInputStream input(reinterpret_cast<const uint8*>(encoded_file.first),
                             encoded_file.second);

  const uint32 kNameTag = internal::WireFormatLite::MakeTag(
      FileDescriptorProto::kNameFieldNumber,
      internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED);

  if (input.ReadTagNoLastTag() == kNameTag) {
    // Success!
    return internal::WireFormatLite::ReadString(&input, output);
  } else {
    // Slow path.  Parse whole message.
    FileDescriptorProto file_proto;
    if (!file_proto.ParseFromArray(encoded_file.first, encoded_file.second)) {
      return false;
    }
    *output = file_proto.name();
    return true;
  }
}